

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONConfigurePresets.cxx
# Opt level: O0

function<bool_(cmCMakePresetsGraph::ConfigurePreset_&,_const_Json::Value_*,_cmJSONState_*)> *
anon_unknown.dwarf_6f918b::ArchToolsetHelper
          (function<bool_(cmCMakePresetsGraph::ConfigurePreset_&,_const_Json::Value_*,_cmJSONState_*)>
           *__return_storage_ptr__,offset_in_ConfigurePreset_to_string valueField,
          offset_in_ConfigurePreset_to_optional<cmCMakePresetsGraph::ArchToolsetStrategy>
          strategyField)

{
  Object<cmCMakePresetsGraph::ConfigurePreset> *pOVar1;
  anon_class_88_3_46d84aa4 local_158;
  basic_string_view<char,_std::char_traits<char>_> local_100;
  basic_string_view<char,_std::char_traits<char>_> local_f0 [2];
  function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  local_d0;
  Object<cmCMakePresetsGraph::ConfigurePreset> local_b0;
  undefined1 local_68 [8];
  Object<cmCMakePresetsGraph::ConfigurePreset> objectHelper;
  offset_in_ConfigurePreset_to_optional<cmCMakePresetsGraph::ArchToolsetStrategy>
  strategyField_local;
  offset_in_ConfigurePreset_to_string valueField_local;
  
  objectHelper._64_8_ = strategyField;
  std::
  function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::
  function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(&)(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_void>
            (&local_d0,JsonErrors::INVALID_OBJECT);
  cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>::Object
            (&local_b0,&local_d0,false);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_f0,"value");
  pOVar1 = cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>::
           Bind<cmCMakePresetsGraph::ConfigurePreset,std::__cxx11::string,bool(*)(std::__cxx11::string&,Json::Value_const*,cmJSONState*)>
                     (&local_b0,local_f0,valueField,cmCMakePresetsGraphInternal::PresetStringHelper,
                      false);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_100,"strategy");
  pOVar1 = cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>::
           Bind<cmCMakePresetsGraph::ConfigurePreset,std::optional<cmCMakePresetsGraph::ArchToolsetStrategy>,bool(*)(std::optional<cmCMakePresetsGraph::ArchToolsetStrategy>&,Json::Value_const*,cmJSONState*)>
                     (pOVar1,&local_100,objectHelper._64_8_,ArchToolsetStrategyHelper,false);
  cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>::Object
            ((Object<cmCMakePresetsGraph::ConfigurePreset> *)local_68,pOVar1);
  cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>::~Object(&local_b0);
  std::
  function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::~function(&local_d0);
  local_158.strategyField = objectHelper._64_8_;
  local_158.valueField = valueField;
  cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>::Object
            (&local_158.objectHelper,(Object<cmCMakePresetsGraph::ConfigurePreset> *)local_68);
  std::function<bool(cmCMakePresetsGraph::ConfigurePreset&,Json::Value_const*,cmJSONState*)>::
  function<(anonymous_namespace)::ArchToolsetHelper(std::__cxx11::string_cmCMakePresetsGraph::ConfigurePreset::*,std::optional<cmCMakePresetsGraph::ArchToolsetStrategy>cmCMakePresetsGraph::ConfigurePreset::*)::__0,void>
            ((function<bool(cmCMakePresetsGraph::ConfigurePreset&,Json::Value_const*,cmJSONState*)>
              *)__return_storage_ptr__,&local_158);
  (anonymous_namespace)::
  ArchToolsetHelper(std::__cxx11::string_cmCMakePresetsGraph::ConfigurePreset::*,std::optional<cmCMakePresetsGraph::ArchToolsetStrategy>cmCMakePresetsGraph::ConfigurePreset::*)
  ::$_0::~__0((__0 *)&local_158);
  cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>::~Object
            ((Object<cmCMakePresetsGraph::ConfigurePreset> *)local_68);
  return __return_storage_ptr__;
}

Assistant:

std::function<bool(ConfigurePreset&, const Json::Value*, cmJSONState*)>
ArchToolsetHelper(
  std::string ConfigurePreset::*valueField,
  cm::optional<ArchToolsetStrategy> ConfigurePreset::*strategyField)
{
  auto const objectHelper =
    JSONHelperBuilder::Object<ConfigurePreset>(JsonErrors::INVALID_OBJECT,
                                               false)
      .Bind("value", valueField,
            cmCMakePresetsGraphInternal::PresetStringHelper, false)
      .Bind("strategy", strategyField, ArchToolsetStrategyHelper, false);
  return [valueField, strategyField,
          objectHelper](ConfigurePreset& out, const Json::Value* value,
                        cmJSONState* state) -> bool {
    if (!value) {
      (out.*valueField).clear();
      out.*strategyField = cm::nullopt;
      return true;
    }

    if (value->isString()) {
      out.*valueField = value->asString();
      out.*strategyField = cm::nullopt;
      return true;
    }

    if (value->isObject()) {
      return objectHelper(out, value, state);
    }

    cmCMakePresetsErrors::INVALID_PRESET(value, state);
    return false;
  };
}